

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

void __thiscall TCV::visit(TCV *this,Calls *node)

{
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  _Elt_pointer ppAVar3;
  ASTNode **child;
  _Elt_pointer ppAVar4;
  _Map_pointer pppAVar5;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar4 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppAVar1 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar4 != ppAVar1) {
    ppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pppAVar5 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    do {
      AST::ASTNode::setParent(*ppAVar4,&node->super_ASTNode);
      (**(*ppAVar4)->_vptr_ASTNode)(*ppAVar4,this);
      lastProcessedNode = lastProcessedNode + 1;
      ppAVar4 = ppAVar4 + 1;
      if (ppAVar4 == ppAVar3) {
        ppAVar4 = pppAVar5[1];
        pppAVar5 = pppAVar5 + 1;
        ppAVar3 = ppAVar4 + 0x40;
      }
    } while (ppAVar4 != ppAVar1);
  }
  lastProcessedNode = -1;
  return;
}

Assistant:

void TCV::visit(Calls *node) {
    for (const auto &child: node->getChildren()) {
        child->setParent(node);
        child->accept(*this);
        lastProcessedNode++;
    }
    lastProcessedNode = -1;
}